

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNBuilderSAH<4,_embree::TriangleMi<4>_>::build
          (BVHNBuilderSAH<4,_embree::TriangleMi<4>_> *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  pointer ppTVar5;
  Device *pDVar6;
  Block *pBVar7;
  PrimRef *pPVar8;
  MemoryMonitorInterface *pMVar9;
  Geometry *pGVar10;
  Scene *pSVar11;
  GTypeMask GVar12;
  double t0;
  double dVar13;
  undefined8 uVar14;
  long lVar15;
  long *plVar16;
  PrimRef *pPVar17;
  NodeRef root;
  uint uVar18;
  long *plVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ulong uVar21;
  BVH **ppBVar22;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *prims;
  __pointer_type pBVar23;
  pointer ppTVar24;
  ulong uVar25;
  ulong uVar26;
  size_t sVar27;
  BVH *pBVar28;
  size_t sVar29;
  float fVar30;
  PrimInfo pinfo;
  string __str;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [3];
  long local_a8;
  long local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  if ((this->mesh != (Geometry *)0x0) && (this->mesh->numPrimitives != this->numPreviousPrimitives))
  {
    pBVar28 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar28->alloc);
    ppTVar24 = (pBVar28->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppTVar5 = (pBVar28->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar24 != ppTVar5) {
      do {
        FastAllocator::ThreadLocal2::unbind(*ppTVar24,&pBVar28->alloc);
        ppTVar24 = ppTVar24 + 1;
      } while (ppTVar24 != ppTVar5);
      ppTVar24 = (pBVar28->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pBVar28->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar24) {
        (pBVar28->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar24;
      }
    }
    LOCK();
    (pBVar28->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar28->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar28->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar28->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar6 = (pBVar28->alloc).device;
      bVar4 = (pBVar28->alloc).useUSM;
      pBVar23 = (pBVar28->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar7 = pBVar23->next;
        FastAllocator::Block::clear_block(pBVar23,pDVar6,bVar4);
        pBVar23 = pBVar7;
      } while (pBVar7 != (Block *)0x0);
    }
    LOCK();
    (pBVar28->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar28->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar6 = (pBVar28->alloc).device;
      bVar4 = (pBVar28->alloc).useUSM;
      pBVar23 = (pBVar28->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar7 = pBVar23->next;
        FastAllocator::Block::clear_block(pBVar23,pDVar6,bVar4);
        pBVar23 = pBVar7;
      } while (pBVar7 != (Block *)0x0);
    }
    LOCK();
    (pBVar28->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar15 = -8;
    do {
      LOCK();
      (pBVar28->alloc).threadBlocks[lVar15]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar28->alloc).threadBlocks[lVar15 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0);
    sVar27 = (pBVar28->alloc).primrefarray.size_alloced;
    pPVar8 = (pBVar28->alloc).primrefarray.items;
    if (pPVar8 != (PrimRef *)0x0) {
      if (sVar27 << 5 < 0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,sVar27 << 5,(pBVar28->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar27 != 0) {
      pMVar9 = (pBVar28->alloc).primrefarray.alloc.device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar27 * -0x20,1);
    }
    (pBVar28->alloc).primrefarray.size_active = 0;
    (pBVar28->alloc).primrefarray.size_alloced = 0;
    (pBVar28->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  if ((this->settings).primrefarrayalloc != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x28);
  }
  pGVar10 = this->mesh;
  if (pGVar10 == (Geometry *)0x0) {
    pSVar11 = this->scene;
    GVar12 = this->gtype_;
    uVar18 = (uint)GVar12;
    if ((uVar18 >> 0x14 & 1) == 0) {
      sVar27 = 0;
    }
    else {
      sVar27 = (pSVar11->world).numTriangles;
    }
    if ((uVar18 >> 0x15 & 1) != 0) {
      sVar27 = sVar27 + (pSVar11->world).numQuads;
    }
    if ((GVar12 & MTY_CURVE2) != ~MTY_ALL) {
      sVar27 = sVar27 + (pSVar11->world).numLineSegments;
    }
    if ((GVar12 & MTY_CURVE4) != ~MTY_ALL) {
      sVar27 = sVar27 + (pSVar11->world).numBezierCurves;
    }
    if ((GVar12 & MTY_POINTS) != ~MTY_ALL) {
      sVar27 = sVar27 + (pSVar11->world).numPoints;
    }
    if ((uVar18 >> 0x17 & 1) != 0) {
      sVar27 = sVar27 + (pSVar11->world).numSubdivPatches;
    }
    if ((uVar18 >> 0x1d & 1) != 0) {
      sVar27 = sVar27 + (pSVar11->world).numUserGeometries;
    }
    if ((uVar18 >> 0x1e & 1) != 0) {
      sVar27 = sVar27 + (pSVar11->world).numInstancesCheap;
    }
    if ((int)uVar18 < 0) {
      sVar27 = sVar27 + (pSVar11->world).numInstancesExpensive;
    }
    if ((uVar18 >> 0x18 & 1) != 0) {
      sVar27 = sVar27 + (pSVar11->world).numInstanceArrays;
    }
    if ((uVar18 >> 0x16 & 1) != 0) {
      sVar27 = sVar27 + (pSVar11->world).numGrids;
    }
    this->numPreviousPrimitives = (uint)sVar27;
    if (sVar27 == 0) goto LAB_00bfbc50;
    pBVar28 = this->bvh;
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct((ulong)local_98,'\x01');
    *local_98[0] = 0x34;
    plVar16 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1f8cf1e);
    local_108 = &local_f8;
    plVar19 = plVar16 + 2;
    if ((long *)*plVar16 == plVar19) {
      local_f8 = *plVar19;
      lStack_f0 = plVar16[3];
    }
    else {
      local_f8 = *plVar19;
      local_108 = (long *)*plVar16;
    }
    local_100 = plVar16[1];
    *plVar16 = (long)plVar19;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_e8._0_8_ = local_d8;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar20) {
      local_d8[0]._0_8_ = paVar20->_M_allocated_capacity;
      local_d8[0]._8_8_ = plVar16[3];
    }
    else {
      local_d8[0]._0_8_ = paVar20->_M_allocated_capacity;
      local_e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar16;
    }
    local_e8._8_8_ = plVar16[1];
    *plVar16 = (long)paVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
  }
  else {
    sVar27 = (size_t)pGVar10->numPrimitives;
    this->numPreviousPrimitives = pGVar10->numPrimitives;
    if (sVar27 == 0) {
LAB_00bfbc50:
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      sVar27 = (this->prims).size_alloced;
      pPVar8 = (this->prims).items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar27 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar27 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar27 != 0) {
        pMVar9 = (this->prims).alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar27 * -0x20,1);
      }
      (this->prims).size_active = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
      return;
    }
    pBVar28 = this->bvh;
    local_e8._0_8_ = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  }
  ppBVar22 = &this->bvh;
  t0 = BVHN<4>::preBuild(pBVar28,(string *)&local_e8.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_);
  }
  if (pGVar10 == (Geometry *)0x0) {
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
  }
  if (this->primrefarrayalloc == true) {
    uVar21 = 0xffffffffffffffff;
    if (999999 < sVar27) {
      uVar21 = sVar27 / 1000;
    }
    (this->settings).primrefarrayalloc = uVar21;
  }
  if (this->mesh != (Geometry *)0x0) {
    ((*ppBVar22)->alloc).atype = EMBREE_OS_MALLOC;
  }
  dVar13 = (double)(sVar27 + 3 >> 2) * 1.2 * 80.0;
  uVar21 = (ulong)dVar13;
  sVar29 = ((long)(dVar13 - 9.223372036854776e+18) & (long)uVar21 >> 0x3f | uVar21) +
           (sVar27 * 0xe0 >> 4);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar29);
  sVar29 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,sVar27,sVar29);
  (this->settings).singleThreadThreshold = sVar29;
  uVar21 = (this->prims).size_alloced;
  uVar26 = uVar21;
  if ((uVar21 < sVar27) && (uVar26 = sVar27, uVar25 = uVar21, uVar21 != 0)) {
    do {
      uVar26 = uVar25 * 2 + (ulong)(uVar25 * 2 == 0);
      uVar25 = uVar26;
    } while (uVar26 < sVar27);
  }
  psVar1 = &(this->prims).size_active;
  if (sVar27 < (this->prims).size_active) {
    *psVar1 = sVar27;
  }
  prims = (EVP_PKEY_CTX *)&this->prims;
  if (uVar21 == uVar26) {
    *psVar1 = sVar27;
    goto LAB_00bfbf92;
  }
  pMVar9 = (this->prims).alloc.device;
  pPVar8 = (this->prims).items;
  uVar21 = uVar26 << 5;
  (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar21,0);
  if (uVar21 < 0x1c00000) {
    pPVar17 = (PrimRef *)alignedMalloc(uVar21,0x20);
  }
  else {
    pPVar17 = (PrimRef *)os_malloc(uVar21,&(this->prims).alloc.hugepages);
  }
  (this->prims).items = pPVar17;
  if ((this->prims).size_active == 0) {
    sVar29 = (this->prims).size_alloced;
    if (pPVar8 != (PrimRef *)0x0) goto LAB_00bfbf43;
  }
  else {
    lVar15 = 0x10;
    uVar21 = 0;
    do {
      pPVar17 = (this->prims).items;
      puVar2 = (undefined8 *)((long)pPVar8 + lVar15 + -0x10);
      uVar14 = puVar2[1];
      puVar3 = (undefined8 *)((long)pPVar17 + lVar15 + -0x10);
      *puVar3 = *puVar2;
      puVar3[1] = uVar14;
      puVar2 = (undefined8 *)((long)&(pPVar8->lower).field_0 + lVar15);
      uVar14 = puVar2[1];
      puVar3 = (undefined8 *)((long)&(pPVar17->lower).field_0 + lVar15);
      *puVar3 = *puVar2;
      puVar3[1] = uVar14;
      uVar21 = uVar21 + 1;
      lVar15 = lVar15 + 0x20;
    } while (uVar21 < (this->prims).size_active);
    sVar29 = (this->prims).size_alloced;
LAB_00bfbf43:
    if (sVar29 << 5 < 0x1c00000) {
      alignedFree(pPVar8);
    }
    else {
      os_free(pPVar8,sVar29 << 5,(this->prims).alloc.hugepages);
    }
  }
  if (sVar29 != 0) {
    pMVar9 = (((mvector<PrimRef> *)prims)->alloc).device;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar29 * -0x20,1);
  }
  (this->prims).size_active = sVar27;
  (this->prims).size_alloced = uVar26;
LAB_00bfbf92:
  if (this->mesh == (Geometry *)0x0) {
    sse2::createPrimRefArray
              ((PrimInfo *)&local_e8.field_1,this->scene,this->gtype_,false,sVar27,
               (mvector<PrimRef> *)prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  else {
    sse2::createPrimRefArray
              ((PrimInfo *)&local_e8.field_1,this->mesh,this->geomID_,sVar27,
               (mvector<PrimRef> *)prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  local_78._8_8_ = this->bvh;
  if (local_a0 == local_a8) {
    (*(((BVH *)local_78._8_8_)->super_AccelData).super_RefCount._vptr_RefCount[5])();
    sVar27 = (this->prims).size_alloced;
    pPVar8 = (this->prims).items;
    if (pPVar8 != (PrimRef *)0x0) {
      if (sVar27 << 5 < 0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,sVar27 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar27 != 0) {
      pMVar9 = (((mvector<PrimRef> *)prims)->alloc).device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar27 * -0x20,1);
    }
    *psVar1 = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  else {
    local_78._0_8_ = &PTR_createLeaf_0218c998;
    root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                     ((BVHNBuilderV *)&local_78,&((BVH *)local_78._8_8_)->alloc,
                      &(((BVH *)local_78._8_8_)->scene->progressInterface).
                       super_BuildProgressMonitor,(this->prims).items,(PrimInfo *)&local_e8.field_1,
                      this->settings);
    local_78._0_8_ = local_e8._0_8_;
    local_78._8_8_ = local_e8._8_8_;
    local_68._0_8_ = local_d8[0]._M_allocated_capacity;
    local_68._8_8_ = local_d8[0]._8_8_;
    local_58._0_8_ = local_e8._0_8_;
    local_58._8_8_ = local_e8._8_8_;
    local_48._0_8_ = local_d8[0]._M_allocated_capacity;
    local_48._8_8_ = local_d8[0]._8_8_;
    BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78,local_a0 - local_a8);
    fVar30 = (float)(ulong)(local_a0 - local_a8) * 0.005;
    uVar21 = (ulong)fVar30;
    ctx = (EVP_PKEY_CTX *)((long)(fVar30 - 9.223372e+18) & (long)uVar21 >> 0x3f | uVar21);
    BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
    if ((this->settings).primrefarrayalloc == 0xffffffffffffffff) {
      if ((this->scene != (Scene *)0x0) &&
         ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
        sVar27 = (this->prims).size_alloced;
        pPVar8 = (this->prims).items;
        if (pPVar8 != (PrimRef *)0x0) {
          ctx = (EVP_PKEY_CTX *)(sVar27 << 5);
          if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
            alignedFree(pPVar8);
          }
          else {
            os_free(pPVar8,(size_t)ctx,(this->prims).alloc.hugepages);
          }
        }
        if (sVar27 != 0) {
          pMVar9 = (((mvector<PrimRef> *)prims)->alloc).device;
          ctx = (EVP_PKEY_CTX *)(sVar27 * -0x20);
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,ctx,1);
        }
        *psVar1 = 0;
        (this->prims).size_alloced = 0;
        (this->prims).items = (PrimRef *)0x0;
      }
    }
    else {
      FastAllocator::share(&(*ppBVar22)->alloc,(mvector<PrimRef> *)prims);
      ctx = prims;
    }
    BVHN<4>::cleanup(*ppBVar22,ctx);
    BVHN<4>::postBuild(*ppBVar22,t0);
  }
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.unshare(prims);

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif

            /* create primref array */
            if (primrefarrayalloc) {
              settings.primrefarrayalloc = numPrimitives/1000;
              if (settings.primrefarrayalloc < 1000)
                settings.primrefarrayalloc = inf;
            }

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* initialize allocator */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::AABBNodeMB)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            prims.resize(numPrimitives);

            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
              createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* pinfo might has zero size due to invalid geometry */
            if (unlikely(pinfo.size() == 0))
            {
              bvh->clear();
              prims.clear();
              return;
            }

            /* call BVH builder */
            NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeaf<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

#if PROFILE
          });
#endif

        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.share(prims);

        /* for static geometries we can do some cleanups */
        else if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }